

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ComputeGeneratedColumns(Parse *pParse,int iRegStore,Table *pTab)

{
  byte *pbVar1;
  ushort uVar2;
  short sVar3;
  Vdbe *pVVar4;
  char *pcVar5;
  Column *pCVar6;
  ExprList *pEVar7;
  bool bVar8;
  i16 iVar9;
  Op *pOVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  Expr *pExpr;
  Column *pCol;
  long lVar14;
  Column *local_68;
  Walker local_60;
  
  sqlite3TableAffinity(pParse->pVdbe,pTab,iRegStore);
  if ((pTab->tabFlags & 0x40) != 0) {
    pVVar4 = pParse->pVdbe;
    if (pVVar4->db->mallocFailed == '\0') {
      pOVar10 = pVVar4->aOp + (long)pVVar4->nOp + -1;
    }
    else {
      pOVar10 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pOVar10->opcode == '_') {
      pOVar10->p3 = 1;
    }
    else if ((pOVar10->opcode == '`') && (pcVar5 = (pOVar10->p4).z, *pcVar5 != '\0')) {
      iVar11 = 0;
      lVar12 = 0xe;
      pcVar13 = pcVar5;
      do {
        uVar2 = *(ushort *)((long)&pTab->aCol->zCnName + lVar12);
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 0x40) != 0) {
            *pcVar13 = '@';
          }
          iVar11 = iVar11 + 1;
        }
        pcVar13 = pcVar5 + iVar11;
        lVar12 = lVar12 + 0x10;
      } while (pcVar5[iVar11] != '\0');
    }
  }
  sVar3 = pTab->nCol;
  if (0 < (long)sVar3) {
    pCVar6 = pTab->aCol;
    lVar12 = 0;
    do {
      uVar2 = *(ushort *)((long)&pCVar6->colFlags + lVar12);
      if ((uVar2 & 0x60) != 0) {
        *(ushort *)((long)&pCVar6->colFlags + lVar12) = uVar2 | 0x80;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)sVar3 * 0x10 != lVar12);
  }
  local_60.xExprCallback = exprColumnFlagUnion;
  local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
  local_60.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  pParse->iSelfTab = -iRegStore;
  local_60.u.pTab = pTab;
  do {
    bVar8 = false;
    if (pTab->nCol < 1) {
      local_68 = (Column *)0x0;
    }
    else {
      lVar12 = 0;
      lVar14 = 0;
      local_68 = (Column *)0x0;
      do {
        pCVar6 = pTab->aCol;
        uVar2 = *(ushort *)((long)&pCVar6->colFlags + lVar12);
        pCol = local_68;
        if ((char)uVar2 < '\0') {
          *(ushort *)((long)&pCVar6->colFlags + lVar12) = uVar2 | 0x100;
          local_60.eCode = 0;
          uVar2 = *(ushort *)((long)&pCVar6->iDflt + lVar12);
          if ((((uVar2 == 0) || (pTab->eTabType != '\0')) ||
              (pEVar7 = (pTab->u).tab.pDfltList, pEVar7 == (ExprList *)0x0)) ||
             (pEVar7->nExpr < (int)(uint)uVar2)) {
            pExpr = (Expr *)0x0;
          }
          else {
            pExpr = pEVar7->a[uVar2 - 1].pExpr;
          }
          if (pExpr != (Expr *)0x0) {
            sqlite3WalkExprNN(&local_60,pExpr);
          }
          pbVar1 = (byte *)((long)&pCVar6->colFlags + lVar12 + 1);
          *pbVar1 = *pbVar1 & 0xfe;
          pCol = (Column *)((long)&pCVar6->zCnName + lVar12);
          if ((local_60.eCode & 0x80) == 0) {
            iVar9 = sqlite3TableColumnToStorage(pTab,(i16)lVar14);
            sqlite3ExprCodeGeneratedColumn(pParse,pTab,pCol,iVar9 + iRegStore);
            pbVar1 = (byte *)((long)&pCVar6->colFlags + lVar12);
            *pbVar1 = *pbVar1 & 0x7f;
            bVar8 = true;
            pCol = local_68;
          }
        }
        local_68 = pCol;
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar14 < pTab->nCol);
    }
  } while ((local_68 != (Column *)0x0) && (bVar8));
  if (local_68 != (Column *)0x0) {
    sqlite3ErrorMsg(pParse,"generated column loop on \"%s\"",local_68->zCnName);
  }
  pParse->iSelfTab = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ComputeGeneratedColumns(
  Parse *pParse,    /* Parsing context */
  int iRegStore,    /* Register holding the first column */
  Table *pTab       /* The table */
){
  int i;
  Walker w;
  Column *pRedo;
  int eProgress;
  VdbeOp *pOp;

  assert( pTab->tabFlags & TF_HasGenerated );
  testcase( pTab->tabFlags & TF_HasVirtual );
  testcase( pTab->tabFlags & TF_HasStored );

  /* Before computing generated columns, first go through and make sure
  ** that appropriate affinity has been applied to the regular columns
  */
  sqlite3TableAffinity(pParse->pVdbe, pTab, iRegStore);
  if( (pTab->tabFlags & TF_HasStored)!=0 ){
    pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Affinity ){
      /* Change the OP_Affinity argument to '@' (NONE) for all stored
      ** columns.  '@' is the no-op affinity and those columns have not
      ** yet been computed. */
      int ii, jj;
      char *zP4 = pOp->p4.z;
      assert( zP4!=0 );
      assert( pOp->p4type==P4_DYNAMIC );
      for(ii=jj=0; zP4[jj]; ii++){
        if( pTab->aCol[ii].colFlags & COLFLAG_VIRTUAL ){
          continue;
        }
        if( pTab->aCol[ii].colFlags & COLFLAG_STORED ){
          zP4[jj] = SQLITE_AFF_NONE;
        }
        jj++;
      }
    }else if( pOp->opcode==OP_TypeCheck ){
      /* If an OP_TypeCheck was generated because the table is STRICT,
      ** then set the P3 operand to indicate that generated columns should
      ** not be checked */
      pOp->p3 = 1;
    }
  }

  /* Because there can be multiple generated columns that refer to one another,
  ** this is a two-pass algorithm.  On the first pass, mark all generated
  ** columns as "not available".
  */
  for(i=0; i<pTab->nCol; i++){
    if( pTab->aCol[i].colFlags & COLFLAG_GENERATED ){
      testcase( pTab->aCol[i].colFlags & COLFLAG_VIRTUAL );
      testcase( pTab->aCol[i].colFlags & COLFLAG_STORED );
      pTab->aCol[i].colFlags |= COLFLAG_NOTAVAIL;
    }
  }

  w.u.pTab = pTab;
  w.xExprCallback = exprColumnFlagUnion;
  w.xSelectCallback = 0;
  w.xSelectCallback2 = 0;

  /* On the second pass, compute the value of each NOT-AVAILABLE column.
  ** Companion code in the TK_COLUMN case of sqlite3ExprCodeTarget() will
  ** compute dependencies and mark remove the COLSPAN_NOTAVAIL mark, as
  ** they are needed.
  */
  pParse->iSelfTab = -iRegStore;
  do{
    eProgress = 0;
    pRedo = 0;
    for(i=0; i<pTab->nCol; i++){
      Column *pCol = pTab->aCol + i;
      if( (pCol->colFlags & COLFLAG_NOTAVAIL)!=0 ){
        int x;
        pCol->colFlags |= COLFLAG_BUSY;
        w.eCode = 0;
        sqlite3WalkExpr(&w, sqlite3ColumnExpr(pTab, pCol));
        pCol->colFlags &= ~COLFLAG_BUSY;
        if( w.eCode & COLFLAG_NOTAVAIL ){
          pRedo = pCol;
          continue;
        }
        eProgress = 1;
        assert( pCol->colFlags & COLFLAG_GENERATED );
        x = sqlite3TableColumnToStorage(pTab, i) + iRegStore;
        sqlite3ExprCodeGeneratedColumn(pParse, pTab, pCol, x);
        pCol->colFlags &= ~COLFLAG_NOTAVAIL;
      }
    }
  }while( pRedo && eProgress );
  if( pRedo ){
    sqlite3ErrorMsg(pParse, "generated column loop on \"%s\"", pRedo->zCnName);
  }
  pParse->iSelfTab = 0;
}